

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmInstruction *inst)

{
  VmValue *pVVar1;
  VmValue *this;
  bool bVar2;
  uint uVar3;
  VmValue **ppVVar4;
  VmConstant *pVVar5;
  VmValue *local_70;
  VmValue *local_58;
  VmValue *edge;
  VmValue *option;
  uint i;
  VmConstant *condition;
  VmInstruction *inst_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  bVar2 = SmallArray<VmValue_*,_8U>::empty(&(inst->super_VmValue).users);
  if (((bVar2) && (((inst->super_VmValue).hasSideEffects & 1U) == 0)) &&
     (((inst->super_VmValue).canBeRemoved & 1U) != 0)) {
    module->deadCodeEliminations = module->deadCodeEliminations + 1;
    if (inst->parent != (VmBlock *)0x0) {
      VmBlock::RemoveInstruction(inst->parent,inst);
    }
  }
  else if ((inst->cmd == VM_INST_JUMP_Z) || (inst->cmd == VM_INST_JUMP_NZ)) {
    ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
    pVVar5 = getType<VmConstant>(*ppVVar4);
    if (pVVar5 != (VmConstant *)0x0) {
      if (inst->cmd == VM_INST_JUMP_Z) {
        if (pVVar5->iValue == 0) {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,1);
          local_58 = *ppVVar4;
        }
        else {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,2);
          local_58 = *ppVVar4;
        }
        anon_unknown.dwarf_c91b1::ChangeInstructionTo
                  (module,inst,VM_INST_JUMP,local_58,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                   (VmValue *)0x0,&module->deadCodeEliminations);
      }
      else {
        if (pVVar5->iValue == 0) {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,2);
          local_70 = *ppVVar4;
        }
        else {
          ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,1);
          local_70 = *ppVVar4;
        }
        anon_unknown.dwarf_c91b1::ChangeInstructionTo
                  (module,inst,VM_INST_JUMP,local_70,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                   (VmValue *)0x0,&module->deadCodeEliminations);
      }
    }
  }
  else if (inst->cmd == VM_INST_PHI) {
    option._4_4_ = 0;
    while (uVar3 = SmallArray<VmValue_*,_4U>::size(&inst->arguments), option._4_4_ < uVar3) {
      ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,option._4_4_);
      pVVar1 = *ppVVar4;
      ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,option._4_4_ + 1);
      this = *ppVVar4;
      uVar3 = SmallArray<VmValue_*,_8U>::size(&this->users);
      if ((uVar3 == 1) &&
         (ppVVar4 = SmallArray<VmValue_*,_8U>::operator[](&this->users,0),
         (VmInstruction *)*ppVVar4 == inst)) {
        VmValue::RemoveUse(pVVar1,&inst->super_VmValue);
        VmValue::RemoveUse(this,&inst->super_VmValue);
        uVar3 = SmallArray<VmValue_*,_4U>::size(&inst->arguments);
        ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,uVar3 - 2);
        pVVar1 = *ppVVar4;
        ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,option._4_4_);
        *ppVVar4 = pVVar1;
        uVar3 = SmallArray<VmValue_*,_4U>::size(&inst->arguments);
        ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,uVar3 - 1);
        pVVar1 = *ppVVar4;
        ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,option._4_4_ + 1);
        *ppVVar4 = pVVar1;
        SmallArray<VmValue_*,_4U>::pop_back(&inst->arguments);
        SmallArray<VmValue_*,_4U>::pop_back(&inst->arguments);
      }
      else {
        option._4_4_ = option._4_4_ + 2;
      }
    }
  }
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmInstruction *inst)
{
	(void)ctx;

	if(inst->users.empty() && !inst->hasSideEffects && inst->canBeRemoved)
	{
		module->deadCodeEliminations++;

		if(inst->parent)
			inst->parent->RemoveInstruction(inst);
	}
	else if(inst->cmd == VM_INST_JUMP_Z || inst->cmd == VM_INST_JUMP_NZ)
	{
		// Remove conditional branches with constant condition
		if(VmConstant *condition = getType<VmConstant>(inst->arguments[0]))
		{
			if(inst->cmd == VM_INST_JUMP_Z)
				ChangeInstructionTo(module, inst, VM_INST_JUMP, condition->iValue == 0 ? inst->arguments[1] : inst->arguments[2], NULL, NULL, NULL, NULL, &module->deadCodeEliminations);
			else
				ChangeInstructionTo(module, inst, VM_INST_JUMP, condition->iValue == 0 ? inst->arguments[2] : inst->arguments[1], NULL, NULL, NULL, NULL, &module->deadCodeEliminations);
		}
	}
	else if(inst->cmd == VM_INST_PHI)
	{
		// Remove incoming branches that are never executed (phi instruction is the only user)
		for(unsigned i = 0; i < inst->arguments.size();)
		{
			VmValue *option = inst->arguments[i];
			VmValue *edge = inst->arguments[i + 1];

			if(edge->users.size() == 1 && edge->users[0] == inst)
			{
				option->RemoveUse(inst);
				edge->RemoveUse(inst);

				inst->arguments[i] = inst->arguments[inst->arguments.size() - 2];
				inst->arguments[i + 1] = inst->arguments[inst->arguments.size() - 1];

				inst->arguments.pop_back();
				inst->arguments.pop_back();
			}
			else
			{
				i += 2;
			}
		}
	}
}